

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall Assimp::FBX::Node::AddChild<long>(Node *this,string *name,long more)

{
  Node c;
  Node NStack_88;
  
  Node(&NStack_88,name);
  AddProperties<long>(&NStack_88,more);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,&NStack_88);
  ~Node(&NStack_88);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }